

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_codewscope(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX;
  int extraout_var;
  undefined8 uVar12;
  long extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  char *extraout_RAX_05;
  dirent *pdVar15;
  size_t sVar16;
  size_t sVar17;
  DIR *__dirp;
  FILE *__stream;
  long lVar18;
  char *pcVar19;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar20;
  char *pcVar21;
  DIR *__s;
  DIR *__name;
  char *pcVar22;
  DIR *paths;
  DIR *__filename;
  undefined1 *puVar23;
  char *pcVar24;
  char *pcVar25;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  char *code;
  bson_t oscope;
  undefined1 auStack_7508 [8];
  undefined1 auStack_7500 [504];
  ulong uStack_7308;
  DIR *pDStack_7300;
  dirent *pdStack_72f8;
  DIR *pDStack_72f0;
  DIR *pDStack_72e8;
  stat sStack_72e0;
  char acStack_7250 [512];
  size_t sStack_7050;
  dirent *pdStack_7048;
  DIR *pDStack_7040;
  char *pcStack_7038;
  code *pcStack_7030;
  char *pcStack_7028;
  ulong uStack_7020;
  char *pcStack_7018;
  DIR *pDStack_7010;
  code *pcStack_7008;
  undefined8 uStack_6fd0;
  undefined1 *puStack_6fc8;
  undefined1 *puStack_6fc0;
  undefined1 auStack_6fb0 [8];
  char *pcStack_6fa8;
  char *pcStack_6f98;
  char *pcStack_6f90;
  undefined8 uStack_6f88;
  undefined8 uStack_6f70;
  DIR aDStack_6f00 [25944];
  char *pcStack_9a8;
  char *pcStack_9a0;
  char *pcStack_998;
  char *pcStack_990;
  code *apcStack_988 [2];
  undefined1 auStack_978 [116];
  uint uStack_904;
  char acStack_900 [256];
  undefined8 uStack_800;
  char *pcStack_7f8;
  char *pcStack_7f0;
  char *pcStack_7e8;
  char *pcStack_7e0;
  char *pcStack_7d8;
  char *pcStack_7d0;
  undefined8 uStack_7c8;
  code *pcStack_7c0;
  char *pcStack_7b8;
  undefined8 uStack_7b0;
  char *pcStack_7a8;
  char *pcStack_7a0;
  char *pcStack_798;
  char *pcStack_790;
  code *pcStack_788;
  undefined8 uStack_780;
  undefined8 uStack_778;
  char *pcStack_770;
  char *pcStack_768;
  char *pcStack_760;
  undefined8 uStack_758;
  bson_t *pbStack_750;
  char *pcStack_748;
  code *pcStack_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  char *pcStack_720;
  char *pcStack_718;
  char *pcStack_710;
  char *pcStack_708;
  char *pcStack_700;
  code *pcStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined1 *puStack_6d8;
  char *pcStack_6d0;
  char *pcStack_6c8;
  code *pcStack_6c0;
  undefined8 uStack_6b8;
  ulong uStack_6b0;
  ulong uStack_6a8;
  undefined1 *puStack_6a0;
  char *pcStack_698;
  void *pvStack_690;
  code *pcStack_688;
  uint uStack_604;
  undefined1 auStack_600 [4];
  uint uStack_5fc;
  ulong uStack_4b0;
  ulong uStack_4a8;
  undefined1 *puStack_4a0;
  char *pcStack_498;
  void *pvStack_490;
  code *apcStack_488 [16];
  uint uStack_404;
  undefined1 auStack_400 [4];
  uint uStack_3fc;
  undefined8 uStack_2b8;
  ulong uStack_2b0;
  undefined1 *puStack_2a8;
  char *pcStack_2a0;
  undefined8 uStack_298;
  code *apcStack_290 [2];
  undefined8 uStack_280;
  code *pcStack_278;
  undefined8 uStack_268;
  code *pcStack_260;
  long lStack_258;
  undefined8 uStack_250;
  code *pcStack_248;
  undefined8 uStack_240;
  int iStack_238;
  int iStack_234;
  undefined8 uStack_230;
  char *pcStack_228;
  code *pcStack_220;
  int iStack_214;
  ulong uStack_210;
  code *pcStack_208;
  undefined8 local_200;
  uint local_18c;
  char *local_188;
  undefined1 local_180 [4];
  uint local_17c;
  
  pcStack_208 = (code *)0x13cdc3;
  pvVar6 = (void *)bson_bcon_magic();
  puVar23 = (undefined1 *)0x0;
  pcStack_208 = (code *)0x13cdea;
  uVar7 = bcon_new(0,"b",pvVar6,0xf,10,0);
  local_200 = 0;
  pcVar25 = "foo";
  pcStack_208 = (code *)0x13ce16;
  uVar8 = bcon_new(0,"foo",pvVar6,0xe,"var a = b;",uVar7);
  pcStack_208 = (code *)0x13ce1e;
  uVar9 = bson_bcone_magic();
  local_200 = 0;
  pcStack_208 = (code *)0x13ce44;
  cVar1 = bcon_extract(uVar8,"foo",uVar9,0xe,&local_188,local_180);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x13cfdd;
    test_codewscope_cold_1();
LAB_0013cfdd:
    pcStack_208 = (code *)0x13cfe2;
    test_codewscope_cold_2();
  }
  else {
    pcStack_208 = (code *)0x13ce5d;
    iVar2 = strcmp(local_188,"var a = b;");
    if (iVar2 != 0) goto LAB_0013cfdd;
    pcStack_208 = (code *)0x13ce75;
    pcVar25 = (char *)bson_get_data(local_180);
    pcStack_208 = (code *)0x13ce80;
    pvVar6 = (void *)bson_get_data(uVar7);
    if (*(uint *)(uVar7 + 4) == local_17c) {
      pcStack_208 = (code *)0x13ce94;
      pvVar10 = (void *)bson_get_data(uVar7);
      pcStack_208 = (code *)0x13cea4;
      pvVar11 = (void *)bson_get_data(local_180);
      pcStack_208 = (code *)0x13ceb2;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar7 + 4));
      if (iVar2 == 0) {
        pcStack_208 = (code *)0x13cec3;
        bson_destroy(local_180);
        pcStack_208 = (code *)0x13cecb;
        bson_destroy(uVar7);
        pcStack_208 = (code *)0x13ced3;
        bson_destroy(uVar8);
        return;
      }
    }
    puVar23 = local_180;
    pcStack_208 = (code *)0x13cef4;
    uVar8 = bson_as_canonical_extended_json(puVar23);
    pcStack_208 = (code *)0x13cf01;
    uVar9 = bson_as_canonical_extended_json(uVar7);
    uVar3 = *(uint *)(uVar7 + 4);
    if (local_17c != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (pcVar25[uVar20] != *(char *)((long)pvVar6 + uVar20)) goto LAB_0013cfd1;
        uVar20 = uVar20 + 1;
      } while (local_17c != (uint)uVar20);
    }
    uVar4 = local_17c;
    if (local_17c < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_208 = (code *)0x13cf4d;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar8,uVar9);
      pcStack_208 = (code *)0x13cf65;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar8 = (ulong)uVar3;
      pcStack_208 = (code *)0x13cf80;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      local_18c = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013cfe7;
      uVar8 = (ulong)local_17c;
      pcStack_208 = (code *)0x13cfaa;
      uVar20 = write(uVar3,pcVar25,uVar8);
      if (uVar20 != uVar8) goto LAB_0013cfec;
      uVar7 = (ulong)*(uint *)(uVar7 + 4);
      pcStack_208 = (code *)0x13cfc0;
      uVar20 = write(uVar4,pvVar6,uVar7);
      if (uVar20 != uVar7) goto LAB_0013cff1;
      uVar20 = (ulong)uVar4;
      pcStack_208 = (code *)0x13cfd1;
      test_codewscope_cold_5();
      uVar9 = extraout_RAX;
LAB_0013cfd1:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_208 = (code *)0x13cfe7;
  test_codewscope_cold_7();
LAB_0013cfe7:
  pcStack_208 = (code *)0x13cfec;
  test_codewscope_cold_6();
LAB_0013cfec:
  pcStack_208 = (code *)0x13cff1;
  test_codewscope_cold_3();
LAB_0013cff1:
  pcStack_208 = test_int32;
  test_codewscope_cold_4();
  pcStack_220 = (code *)0x13cfff;
  uStack_210 = uVar7;
  pcStack_208 = (code *)pvVar6;
  iStack_214 = extraout_var;
  uVar9 = bson_bcon_magic();
  pcStack_220 = (code *)0x13d023;
  uVar9 = bcon_new(0,"foo",uVar9,0xf,10,0);
  pcStack_220 = (code *)0x13d02b;
  uVar12 = bson_bcone_magic();
  pcStack_220 = (code *)0x13d048;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0xf,&iStack_214,0);
  if (cVar1 == '\0') {
    pcStack_220 = (code *)0x13d068;
    test_int32_cold_1();
  }
  else if (iStack_214 == 10) {
    pcStack_220 = (code *)0x13d05b;
    bson_destroy(uVar9);
    return;
  }
  pcStack_220 = test_timestamp;
  test_int32_cold_2();
  pcStack_228 = "foo";
  pcStack_248 = (code *)0x13d07b;
  uStack_230 = uVar9;
  pcStack_220 = (code *)pcVar25;
  uVar9 = bson_bcon_magic();
  pvVar6 = (void *)0x0;
  uStack_240 = 0;
  pcStack_248 = (code *)0x13d0a9;
  uVar9 = bcon_new(0,"foo",uVar9,0x10,100,1000);
  pcStack_248 = (code *)0x13d0b1;
  uVar12 = bson_bcone_magic();
  uStack_240 = 0;
  pcStack_248 = (code *)0x13d0d4;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x10,&iStack_234,&iStack_238);
  if (cVar1 == '\0') {
    pcStack_248 = (code *)0x13d100;
    test_timestamp_cold_1();
LAB_0013d100:
    pcStack_248 = (code *)0x13d105;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_234 != 100) goto LAB_0013d100;
    if (iStack_238 == 1000) {
      pcStack_248 = (code *)0x13d0f1;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_248 = test_int64;
  test_timestamp_cold_3();
  pcStack_248 = (code *)0x1403a7;
  pcStack_260 = (code *)0x13d113;
  lStack_258 = extraout_RAX_00;
  uStack_250 = uVar9;
  uVar9 = bson_bcon_magic();
  pcStack_260 = (code *)0x13d137;
  uVar9 = bcon_new(0,"foo",uVar9,0x11,10,0);
  pcStack_260 = (code *)0x13d13f;
  uVar12 = bson_bcone_magic();
  pcStack_260 = (code *)0x13d15a;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x11,&lStack_258,0);
  if (cVar1 == '\0') {
    pcStack_260 = (code *)0x13d17a;
    test_int64_cold_1();
  }
  else if (lStack_258 == 10) {
    pcStack_260 = (code *)0x13d16d;
    bson_destroy(uVar9);
    return;
  }
  pcStack_260 = test_maxkey;
  test_int64_cold_2();
  pcStack_260 = (code *)0x1403a7;
  pcStack_278 = (code *)0x13d188;
  uStack_268 = uVar9;
  uVar9 = bson_bcon_magic();
  pcStack_278 = (code *)0x13d1a6;
  uVar9 = bcon_new(0,"foo",uVar9,0x13,0);
  pcStack_278 = (code *)0x13d1ae;
  uVar12 = bson_bcone_magic();
  pcStack_278 = (code *)0x13d1c6;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar9);
    return;
  }
  pcStack_278 = test_minkey;
  test_maxkey_cold_1();
  pcStack_278 = (code *)0x1403a7;
  apcStack_290[0] = (code *)0x13d1e7;
  uStack_280 = uVar9;
  uVar9 = bson_bcon_magic();
  apcStack_290[0] = (code *)0x13d205;
  uVar9 = bcon_new(0,"foo",uVar9,0x14,0);
  apcStack_290[0] = (code *)0x13d20d;
  uVar12 = bson_bcone_magic();
  apcStack_290[0] = (code *)0x13d225;
  cVar1 = bcon_extract(uVar9,"foo",uVar12,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar9);
    return;
  }
  apcStack_290[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_298 = 0;
  pcStack_2a0 = "foo";
  apcStack_488[0] = (code *)0x13d26e;
  uStack_2b8 = uVar9;
  uStack_2b0 = uVar8;
  puStack_2a8 = puVar23;
  apcStack_290[0] = (code *)&stack0xfffffffffffffff8;
  uVar7 = bcon_new(0,"bar","baz",0);
  apcStack_488[0] = (code *)0x13d276;
  uVar9 = bson_bcon_magic();
  pcVar25 = "foo";
  apcStack_488[0] = (code *)0x13d297;
  uVar8 = bcon_new(0,"foo",uVar9,2,uVar7,0);
  apcStack_488[0] = (code *)0x13d29f;
  uVar9 = bson_bcone_magic();
  apcStack_488[0] = (code *)0x13d2bf;
  cVar1 = bcon_extract(uVar8,"foo",uVar9,2,auStack_400,0);
  if (cVar1 == '\0') {
    apcStack_488[0] = (code *)0x13d43f;
    test_bson_document_cold_1();
  }
  else {
    apcStack_488[0] = (code *)0x13d2d7;
    pvVar6 = (void *)bson_get_data(auStack_400);
    apcStack_488[0] = (code *)0x13d2e2;
    pcVar25 = (char *)bson_get_data(uVar7);
    if (*(uint *)(uVar7 + 4) == uStack_3fc) {
      apcStack_488[0] = (code *)0x13d2f6;
      pvVar10 = (void *)bson_get_data(uVar7);
      apcStack_488[0] = (code *)0x13d306;
      pvVar11 = (void *)bson_get_data(auStack_400);
      apcStack_488[0] = (code *)0x13d314;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar7 + 4));
      if (iVar2 == 0) {
        apcStack_488[0] = (code *)0x13d325;
        bson_destroy(auStack_400);
        apcStack_488[0] = (code *)0x13d32d;
        bson_destroy(uVar7);
        apcStack_488[0] = (code *)0x13d335;
        bson_destroy(uVar8);
        return;
      }
    }
    puVar23 = auStack_400;
    apcStack_488[0] = (code *)0x13d356;
    uVar8 = bson_as_canonical_extended_json(puVar23);
    apcStack_488[0] = (code *)0x13d363;
    uVar9 = bson_as_canonical_extended_json(uVar7);
    uVar3 = *(uint *)(uVar7 + 4);
    if (uStack_3fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar6 + uVar20) != pcVar25[uVar20]) goto LAB_0013d433;
        uVar20 = uVar20 + 1;
      } while (uStack_3fc != (uint)uVar20);
    }
    uVar4 = uStack_3fc;
    if (uStack_3fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_488[0] = (code *)0x13d3af;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar8,uVar9);
      apcStack_488[0] = (code *)0x13d3c7;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar8 = (ulong)uVar3;
      apcStack_488[0] = (code *)0x13d3e2;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_404 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d444;
      uVar8 = (ulong)uStack_3fc;
      apcStack_488[0] = (code *)0x13d40c;
      uVar20 = write(uVar3,pvVar6,uVar8);
      if (uVar20 != uVar8) goto LAB_0013d449;
      uVar7 = (ulong)*(uint *)(uVar7 + 4);
      apcStack_488[0] = (code *)0x13d422;
      uVar20 = write(uVar4,pcVar25,uVar7);
      if (uVar20 != uVar7) goto LAB_0013d44e;
      uVar20 = (ulong)uVar4;
      apcStack_488[0] = (code *)0x13d433;
      test_bson_document_cold_4();
      uVar9 = extraout_RAX_01;
LAB_0013d433:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_488[0] = (code *)0x13d444;
  test_bson_document_cold_6();
LAB_0013d444:
  apcStack_488[0] = (code *)0x13d449;
  test_bson_document_cold_5();
LAB_0013d449:
  apcStack_488[0] = (code *)0x13d44e;
  test_bson_document_cold_2();
LAB_0013d44e:
  apcStack_488[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_688 = (code *)0x13d484;
  uStack_4b0 = uVar7;
  uStack_4a8 = uVar8;
  puStack_4a0 = puVar23;
  pcStack_498 = pcVar25;
  pvStack_490 = pvVar6;
  apcStack_488[0] = (code *)apcStack_290;
  uVar7 = bcon_new(0,"0","baz",0);
  pcStack_688 = (code *)0x13d48c;
  uVar9 = bson_bcon_magic();
  pcVar25 = "foo";
  pcStack_688 = (code *)0x13d4ad;
  uVar8 = bcon_new(0,"foo",uVar9,3,uVar7,0);
  pcStack_688 = (code *)0x13d4b5;
  uVar9 = bson_bcone_magic();
  pcStack_688 = (code *)0x13d4d5;
  cVar1 = bcon_extract(uVar8,"foo",uVar9,3,auStack_600,0);
  if (cVar1 == '\0') {
    pcStack_688 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_688 = (code *)0x13d4ed;
    pvVar6 = (void *)bson_get_data(auStack_600);
    pcStack_688 = (code *)0x13d4f8;
    pcVar25 = (char *)bson_get_data(uVar7);
    if (*(uint *)(uVar7 + 4) == uStack_5fc) {
      pcStack_688 = (code *)0x13d50c;
      pvVar10 = (void *)bson_get_data(uVar7);
      pcStack_688 = (code *)0x13d51c;
      pvVar11 = (void *)bson_get_data(auStack_600);
      pcStack_688 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar7 + 4));
      if (iVar2 == 0) {
        pcStack_688 = (code *)0x13d53b;
        bson_destroy(auStack_600);
        pcStack_688 = (code *)0x13d543;
        bson_destroy(uVar7);
        pcStack_688 = (code *)0x13d54b;
        bson_destroy(uVar8);
        return;
      }
    }
    puVar23 = auStack_600;
    pcStack_688 = (code *)0x13d56c;
    uVar8 = bson_as_canonical_extended_json(puVar23);
    pcStack_688 = (code *)0x13d579;
    uVar9 = bson_as_canonical_extended_json(uVar7);
    uVar3 = *(uint *)(uVar7 + 4);
    if (uStack_5fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar6 + uVar20) != pcVar25[uVar20]) goto LAB_0013d649;
        uVar20 = uVar20 + 1;
      } while (uStack_5fc != (uint)uVar20);
    }
    uVar4 = uStack_5fc;
    if (uStack_5fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_688 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar8,uVar9);
      pcStack_688 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar8 = (ulong)uVar3;
      pcStack_688 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_604 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      uVar8 = (ulong)uStack_5fc;
      pcStack_688 = (code *)0x13d622;
      uVar20 = write(uVar3,pvVar6,uVar8);
      if (uVar20 != uVar8) goto LAB_0013d65f;
      uVar7 = (ulong)*(uint *)(uVar7 + 4);
      pcStack_688 = (code *)0x13d638;
      uVar20 = write(uVar4,pcVar25,uVar7);
      if (uVar20 != uVar7) goto LAB_0013d664;
      uVar20 = (ulong)uVar4;
      pcStack_688 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar9 = extraout_RAX_02;
LAB_0013d649:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_688 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_688 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_688 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_688 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_6c0 = (code *)0x13d679;
  uStack_6b8 = extraout_RAX_03;
  uStack_6b0 = uVar7;
  uStack_6a8 = uVar8;
  puStack_6a0 = puVar23;
  pcStack_698 = pcVar25;
  pvStack_690 = pvVar6;
  pcStack_688 = (code *)apcStack_488;
  uStack_6e8 = bson_bcon_magic();
  pcStack_6c8 = (char *)0x0;
  pcStack_6d0 = "]";
  puStack_6d8 = (undefined1 *)0x2;
  uStack_6e0 = 0xf;
  uStack_6f0 = 0x13d6c1;
  uVar9 = bcon_new(0,"foo","[",uStack_6e8,0xf,1);
  pcStack_6c0 = (code *)0x13d6cd;
  uStack_6e8 = bson_bcone_magic();
  pcStack_6c8 = (char *)0x0;
  pcStack_6d0 = "]";
  uStack_6e0 = 0xf;
  uStack_6f0 = 0x13d6fc;
  puStack_6d8 = (undefined1 *)&uStack_6b8;
  cVar1 = bcon_extract(uVar9,"foo","[",uStack_6e8,0xf,(long)&uStack_6b8 + 4);
  if (cVar1 == '\0') {
    pcStack_6c0 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_6c0 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_6b8._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_6b8 == 2) {
      pcStack_6c0 = (code *)0x13d719;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_6c0 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_6c0 = (code *)0x14a05b;
  pcStack_6c8 = "[";
  pcStack_6d0 = "foo";
  puStack_6d8 = (undefined1 *)0x0;
  uStack_6e0 = 0xf;
  pcStack_6f8 = (code *)0x13d747;
  uStack_6f0 = extraout_RAX_04;
  uStack_6e8 = uVar9;
  pcStack_720 = (char *)bson_bcon_magic();
  pcStack_700 = (char *)0x0;
  pcStack_708 = "}";
  pcStack_710 = (char *)0x1;
  pcStack_718 = (char *)0xf;
  uStack_728 = "a";
  uStack_730 = 2;
  uStack_738 = 0x13d79a;
  uVar9 = bcon_new(0,"foo","{","b",pcStack_720,0xf);
  pcStack_6f8 = (code *)0x13d7a6;
  pcStack_720 = (char *)bson_bcone_magic();
  uStack_730 = (long)&uStack_6f0 + 4;
  pcStack_700 = (char *)0x0;
  pcStack_708 = "}";
  pcStack_718 = (char *)0xf;
  uStack_728 = "b";
  uStack_738 = 0x13d7e9;
  pcStack_710 = (char *)&uStack_6f0;
  cVar1 = bcon_extract(uVar9,"foo","{","a",pcStack_720,0xf);
  if (cVar1 == '\0') {
    pcStack_6f8 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_6f8 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_6f0._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_6f0 == 2) {
      pcStack_6f8 = (code *)0x13d806;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_6f8 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_6f8 = (code *)0x0;
  pcStack_700 = "a";
  pcStack_710 = "{";
  pcStack_718 = "foo";
  pcStack_720 = "}";
  pcStack_740 = (code *)0x13d837;
  pcStack_708 = (char *)uVar9;
  uStack_778 = (undefined8 *)bson_bcon_magic();
  pcStack_740 = (code *)0x0;
  pcStack_748 = (char *)0x3;
  pbStack_750 = (bson_t *)0xf;
  pcStack_760 = "c";
  pcStack_768 = (char *)0x2;
  pcStack_770 = (char *)0xf;
  uStack_780 = 0x13d879;
  uStack_758 = uStack_778;
  bson = (bson_t *)bcon_new(0,"a",uStack_778,0xf,1,"b");
  pcStack_740 = (code *)0x13d885;
  pcStack_788 = (code *)bson_bcone_magic();
  pbStack_750 = (bson_t *)((long)&uStack_730 + 4);
  uStack_778 = &uStack_728;
  pcStack_748 = (char *)0x0;
  uStack_758 = 0xf;
  pcStack_768 = "c";
  pcStack_770 = (char *)0x0;
  uStack_780 = 0xf;
  pcStack_790 = "b";
  pcStack_798 = (char *)0x0;
  pcStack_7a0 = (char *)0x13d8d1;
  pcStack_760 = (char *)pcStack_788;
  test_extract_ctx_helper(bson,3,"a",pcStack_788,0xf,(long)&uStack_728 + 4);
  if (uStack_728._4_4_ == 1) {
    if ((int)uStack_728 != 2) goto LAB_0013d906;
    if (uStack_730._4_4_ == 3) {
      pcStack_740 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_740 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_740 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_740 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_740 = (code *)0xf;
  pcStack_748 = "a";
  uStack_758 = 0;
  pcStack_768 = "c";
  pcStack_788 = (code *)0x13d923;
  pcStack_760 = (char *)((long)&uStack_728 + 4);
  pbStack_750 = bson;
  uStack_7b0 = bson_bcon_magic();
  pcStack_790 = (char *)0x0;
  pcStack_798 = "}";
  pcStack_7a0 = (char *)0xa;
  pcStack_7a8 = (char *)0xf;
  pcStack_7b8 = (char *)0x13d978;
  uVar9 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_788 = (code *)0x13d984;
  uStack_7b0 = bson_bcone_magic();
  pcStack_7a0 = (char *)((long)&uStack_778 + 4);
  pcStack_790 = (char *)0x0;
  pcStack_798 = "}";
  pcStack_7a8 = (char *)0xf;
  pcStack_7b8 = "bar";
  pcStack_7c0 = (code *)0x141970;
  uStack_7c8 = 0x13d9c0;
  cVar1 = bcon_extract(uVar9,"hello",uStack_7b0,0,&pcStack_770,"foo");
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_788 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_788 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_770);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_778._4_4_ == 10) {
      pcStack_788 = (code *)0x13d9ec;
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_788 = test_skip;
  test_nested_cold_3();
  pcStack_788 = (code *)0x14ad57;
  pcStack_790 = "bar";
  pcStack_798 = (char *)0x0;
  pcStack_7a0 = "hello";
  pcStack_7a8 = "foo";
  pcStack_7c0 = (code *)0x13da1a;
  uStack_7b0 = uVar9;
  pcStack_7e8 = (char *)bson_bcon_magic();
  uStack_7c8 = 0;
  pcStack_7d0 = "}";
  pcStack_7d8 = (char *)0xa;
  pcStack_7e0 = (char *)0xf;
  pcStack_7f0 = (char *)0x13da6d;
  uVar9 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_7c0 = (code *)0x13da79;
  pcVar25 = (char *)bson_bcone_magic();
  pcVar24 = "}";
  uStack_7c8 = 0;
  pcStack_7d0 = "}";
  pcStack_7d8 = (char *)0x10;
  pcStack_7e0 = (char *)0x1c;
  pcStack_7f0 = "bar";
  pcStack_7f8 = "{";
  uStack_800 = 0x13dab5;
  pcStack_7e8 = pcVar25;
  cVar1 = bcon_extract(uVar9,"hello",pcVar25,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_7c0 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_7c8 = 0;
    pcStack_7d0 = "}";
    pcStack_7d8 = (char *)0x12;
    pcStack_7e0 = (char *)0x1c;
    pcStack_7f0 = "bar";
    pcStack_7f8 = "{";
    uStack_800 = 0x13daf4;
    pcStack_7e8 = pcVar25;
    cVar1 = bcon_extract(uVar9,"hello",pcVar25,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar9);
      return;
    }
  }
  pcStack_7c0 = test_iter;
  test_skip_cold_2();
  pcStack_7c0 = (code *)0x14e902;
  pcStack_7d0 = "bar";
  pcStack_7d8 = "}";
  pcStack_7e8 = "{";
  apcStack_988[0] = (code *)0x13db39;
  pcStack_7e0 = pcVar25;
  uStack_7c8 = uVar9;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_988[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_988[0] = (code *)0x13db68;
  uVar9 = bson_bcone_magic();
  pcVar13 = acStack_900;
  pcVar21 = "foo";
  pcVar19 = (char *)0x1d;
  uVar12 = 0;
  apcStack_988[0] = (code *)0x13db88;
  pcVar22 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar9);
  if (cVar1 == '\0') {
    apcStack_988[0] = (code *)0x13dd34;
    uVar9 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_988[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar22 = acStack_900;
    apcStack_988[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar9 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar22 = acStack_900;
    apcStack_988[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar9 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar12 = 0;
      apcStack_988[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_900);
      apcStack_988[0] = (code *)0x13dbea;
      pcVar25 = (char *)bson_get_data(__n_00);
      apcStack_988[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_988[0] = (code *)0x13dc09;
        pvVar6 = (void *)bson_get_data(__n);
        apcStack_988[0] = (code *)0x13dc14;
        pvVar10 = (void *)bson_get_data(__n_00);
        apcStack_988[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar6,pvVar10,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_988[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_988[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_988[0] = (code *)0x13dc4f;
      pcVar24 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_988[0] = (code *)0x13dc5c;
      pcVar13 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar9 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          if (uVar4 == (uint)uVar7) break;
          if (pcVar25[uVar7] != __buf[uVar7]) goto LAB_0013dd28;
          uVar7 = uVar7 + 1;
        } while (uVar3 != (uint)uVar7);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar7 = (ulong)(uVar3 - 1);
      pcVar19 = pcVar24;
      while( true ) {
        apcStack_988[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar7);
        apcStack_988[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar24 = (char *)(ulong)uVar3;
        pcVar22 = "failure.expected.bson";
        pcVar21 = (char *)0x42;
        apcStack_988[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_904 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar24 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar22 = (char *)(ulong)uVar3;
        apcStack_988[0] = (code *)0x13dd01;
        pcVar21 = pcVar25;
        pcVar14 = (char *)write(uVar3,pcVar25,(size_t)__n_00);
        if (pcVar14 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_988[0] = (code *)0x13dd17;
        pcVar21 = __buf;
        pcVar22 = pcVar24;
        pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar14 != __n) goto LAB_0013dd4d;
        uVar7 = (ulong)uVar4;
        apcStack_988[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar13 = extraout_RAX_05;
LAB_0013dd28:
        uVar7 = uVar7 & 0xffffffff;
        pcVar19 = pcVar24;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_988[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_988[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_988[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_988[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_988[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6fc0 = auStack_6fb0;
  if (extraout_AL != '\0') {
    uStack_6f70 = uVar9;
  }
  pcStack_7008 = (code *)0x13ddd5;
  pcStack_6fa8 = pcVar21;
  pcStack_6f98 = pcVar19;
  pcStack_6f90 = pcVar13;
  uStack_6f88 = uVar12;
  pcStack_9a8 = __n;
  pcStack_9a0 = pcVar25;
  pcStack_998 = __buf;
  pcStack_990 = __n_00;
  apcStack_988[0] = (code *)&pcStack_7c0;
  bcon_extract_ctx_init(aDStack_6f00);
  puStack_6fc8 = auStack_978;
  uStack_6fd0 = 0x3000000010;
  uVar9 = 0x10;
  if (0 < (int)(uint)pcStack_6fa8) {
    uVar3 = (uint)pcStack_6fa8;
    do {
      pcStack_7008 = (code *)0x13de41;
      __s = aDStack_6f00;
      pcVar25 = pcVar22;
      cVar1 = bcon_extract_ctx_va(pcVar22,aDStack_6f00,&uStack_6fd0);
      iVar2 = (int)uVar9;
      if (cVar1 == '\0') {
        pcStack_7008 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_7030 = (code *)0x13de73;
        __name = __s;
        pcStack_7028 = pcVar22;
        uStack_7020 = (ulong)uVar3;
        pcStack_7018 = pcVar24;
        pDStack_7010 = aDStack_6f00;
        pcStack_7008 = (code *)&uStack_6fd0;
        pdVar15 = (dirent *)strlen(pcVar25);
        pcStack_7030 = (code *)0x13de7e;
        paths = __s;
        sVar16 = strlen((char *)__s);
        if ((int)sVar16 + (int)pdVar15 < 499) {
          pcStack_7030 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_7030 = (code *)0x13dea8;
          strncat(__dest,pcVar25,(long)(int)pdVar15);
          pcStack_7030 = (code *)0x13deb0;
          sVar17 = strlen(__dest);
          (__dest + sVar17)[0] = '/';
          (__dest + sVar17)[1] = '\0';
          pcStack_7030 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar16);
          pcVar25 = __dest;
          do {
            if (*pcVar25 == '\\') {
              *pcVar25 = '/';
            }
            else if (*pcVar25 == '\0') {
              return;
            }
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        pcStack_7030 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar7 = (ulong)extraout_EDX;
        pDStack_72e8 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_7050 = sVar16;
        pdStack_7048 = pdVar15;
        pDStack_7040 = __s;
        pcStack_7038 = pcVar25;
        pcStack_7030 = (code *)apcStack_988;
        __dirp = opendir((char *)__name);
        pDStack_72f0 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_72e8 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar15 = readdir(__dirp);
        do {
          if (pdVar15 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_72e8 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar7;
          if (iVar2 <= paths_index) {
            pDStack_72e8 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_72f0 = __dirp;
LAB_0013e018:
            pDStack_72e8 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_7308 = uVar7;
            pDStack_7300 = paths;
            pdStack_72f8 = pdVar15;
            pDStack_72e8 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar16 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar16) {
                pvVar6 = (void *)bson_malloc0(sVar16);
                sVar17 = fread(pvVar6,1,sVar16,__stream);
                if (sVar17 != sVar16) {
                  abort();
                }
                fclose(__stream);
                if (pvVar6 != (void *)0x0) {
                  lVar18 = bson_new_from_json(pvVar6,sVar16,auStack_7508);
                  if (lVar18 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7500);
                    abort();
                  }
                  bson_free(pvVar6);
                }
              }
            }
            return;
          }
          while ((pdVar15->d_name[0] == '.' &&
                 (((pdVar15->d_name[1] == '.' && (pdVar15->d_name[2] == '\0')) ||
                  (pdVar15->d_name[1] == '\0'))))) {
            pDStack_72e8 = (DIR *)0x13df58;
            pdVar15 = readdir(__dirp);
            if (pdVar15 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar25 = pdVar15->d_name;
          pDStack_72e8 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar25,acStack_7250);
          pDStack_72e8 = (DIR *)0x13df87;
          iVar5 = stat(pcVar25,&sStack_72e0);
          if ((iVar5 == 0) && ((sStack_72e0.st_mode & 0xf000) == 0x4000)) {
            pDStack_72e8 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_7250,paths_index,iVar2);
            uVar7 = (ulong)uVar3;
          }
          else {
            pDStack_72e8 = (DIR *)0x13dfc4;
            pcVar24 = strstr(pcVar25,".json");
            if (pcVar24 != (char *)0x0) {
              uVar7 = (ulong)(paths_index + 1);
              pDStack_72e8 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar25,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_72e8 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar15 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_codewscope (void)
{
   const char *code;
   bson_t oscope;

   bson_t *scope = BCON_NEW ("b", BCON_INT32 (10));
   bson_t *bcon = BCON_NEW ("foo", BCON_CODEWSCOPE ("var a = b;", scope));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_CODEWSCOPE (code, oscope)));

   BSON_ASSERT (strcmp (code, "var a = b;") == 0);
   bson_eq_bson (&oscope, scope);

   bson_destroy (&oscope);
   bson_destroy (scope);
   bson_destroy (bcon);
}